

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,
          TPZCompElH1<pzshape::TPZShapeQuad> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  iterator iVar1;
  mapped_type_conflict *pmVar2;
  ostream *poVar3;
  long lVar4;
  int64_t glIdx;
  TPZManVector<long,_9> *local_1e0;
  char *local_1d8 [4];
  stringstream sout;
  ostream local_1a8 [376];
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0178b670;
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeQuad>,&PTR_PTR_017867a8,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapeQuad>,gl2lcConMap,gl2lcElMap);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_017863d8;
  local_1e0 = &this->fConnectIndexes;
  _sout = 0xffffffffffffffff;
  TPZManVector<long,_9>::TPZManVector(local_1e0,9,(long *)&sout);
  this->fh1fam = copy->fh1fam;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 9) {
      return;
    }
    glIdx = (copy->fConnectIndexes).super_TPZVec<long>.fStore[lVar4];
    iVar1 = std::
            _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
            ::find(&gl2lcConMap->_M_t,&glIdx);
    if ((_Rb_tree_header *)iVar1._M_node == &(gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header)
    break;
    pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcConMap,&glIdx);
    (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar4] = *pmVar2;
    lVar4 = lVar4 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&sout);
  poVar3 = std::operator<<(local_1a8,"ERROR in : ");
  poVar3 = std::operator<<(poVar3,
                           "TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1(TPZCompMesh &, const TPZCompElH1<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapeQuad]"
                          );
  poVar3 = std::operator<<(poVar3," trying to clone the connect index: ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3," wich is not in mapped connect indexes!");
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<((ostream *)&std::cout,local_1d8[0]);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)local_1d8);
  (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar4] = -1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&sout);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh,
								 const TPZCompElH1<TSHAPE> &copy,
								 std::map<int64_t,int64_t> & gl2lcConMap,
								 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElH1::ClassId), 
TPZIntelGen<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap), fh1fam(copy.fh1fam)
{
	int i;
	for(i=0;i<TSHAPE::NSides;i++)
	{
		int64_t lcIdx = -1;
		int64_t glIdx = copy.fConnectIndexes[i];
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end()) lcIdx = gl2lcConMap[glIdx];
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			fConnectIndexes[i] = -1;
			return;
		}
		fConnectIndexes[i] = lcIdx;
	}
  //TODO:NATHANFRAN
}